

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O3

int process_symbol(byte_t symbol,byte_t *output_buffer,FILE *output_file_ptr)

{
  int iVar1;
  adh_node_t *paVar2;
  undefined7 in_register_00000039;
  
  paVar2 = adh_search_symbol_in_tree((adh_symbol_t)CONCAT71(in_register_00000039,symbol));
  if (paVar2 != (adh_node_t *)0x0) {
    iVar1 = output_existing_symbol(symbol,paVar2,output_buffer,output_file_ptr);
    return iVar1;
  }
  paVar2 = get_nyt();
  iVar1 = output_bit_array(&paVar2->bit_array,output_buffer,output_file_ptr);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = output_new_symbol(symbol,output_buffer,output_file_ptr);
  return iVar1;
}

Assistant:

int process_symbol(byte_t symbol, byte_t *output_buffer, FILE* output_file_ptr) {
#ifdef _DEBUG
    log_debug(" process_symbol", "%s out_bit_idx=%-8d\n",
            fmt_symbol(symbol),
            out_bit_idx);
#endif
    int rc;
    adh_node_t* node = adh_search_symbol_in_tree(symbol);
    if(node == NULL) {
        // symbol not present in tree
        rc = output_nyt(output_buffer, output_file_ptr);
        if(rc == RC_OK) {
            rc = output_new_symbol(symbol, output_buffer, output_file_ptr);
        }
    } else {
        // symbol already present in tree
        rc = output_existing_symbol(symbol, node, output_buffer, output_file_ptr);
    }
    return rc;
}